

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O0

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  long in_RSI;
  IteratorWrapper *in_RDI;
  long in_FS_OFFSET;
  int i;
  Status *status;
  Status *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  IteratorWrapper *this_00;
  int local_28;
  Status local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  Status::Status(in_stack_ffffffffffffff98);
  for (local_28 = 0; local_28 < *(int *)(in_RSI + 0x38); local_28 = local_28 + 1) {
    IteratorWrapper::status(this_00);
    Status::operator=((Status *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                      &local_10);
    Status::~Status(in_stack_ffffffffffffff98);
    in_stack_ffffffffffffffaf = Status::ok(in_stack_ffffffffffffff98);
    if (!(bool)in_stack_ffffffffffffffaf) break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (Status)(char *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }